

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

string * __thiscall
rcg::Device::getDisplayName_abi_cxx11_(string *__return_storage_ptr__,Device *this)

{
  mutex *__mutex;
  pointer pcVar1;
  int iVar2;
  undefined8 uVar3;
  DEVICE_INFO_CMD in_R8D;
  string local_40;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
               (shared_ptr<const_rcg::GenTLWrapper> *)0x6,in_R8D);
    if (__return_storage_ptr__->_M_string_length == 0) {
      (anonymous_namespace)::cDevGetInfo_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)this,(Device *)&this->gentl,
                 (shared_ptr<const_rcg::GenTLWrapper> *)0x4,in_R8D);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &__return_storage_ptr__->field_2) {
    operator_delete(pcVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

std::string Device::getDisplayName()
{
  std::lock_guard<std::mutex> lock(mtx);

  // return user defined name if available, otherwise the display name that
  // the producer provides

  std::string ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_USER_DEFINED_NAME);

  if (ret.size() == 0)
  {
    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}